

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printRegisterList(MCInst *MI,uint OpNum,SStream *O)

{
  byte bVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  MCOperand *pMVar8;
  char *s;
  int iVar9;
  
  SStream_concat0(O,"{");
  pcVar2 = MI->csh;
  if (pcVar2->detail == CS_OPT_OFF) {
    uVar4 = '\0';
  }
  else {
    uVar5 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar7 = ARM_get_op_access(pcVar2,uVar5);
    uVar4 = '\0';
    if (puVar7[bVar1] != 0x80) {
      uVar4 = puVar7[bVar1];
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 != OpNum) {
    iVar9 = 0;
    do {
      if (iVar9 != 0) {
        SStream_concat0(O,", ");
      }
      pcVar2 = MI->csh;
      pMVar8 = MCInst_getOperand(MI,OpNum + iVar9);
      uVar6 = MCOperand_getReg(pMVar8);
      s = (*pcVar2->get_regname)(uVar6);
      SStream_concat0(O,s);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        puVar7 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x41;
        puVar7[0] = '\x01';
        puVar7[1] = '\0';
        puVar7[2] = '\0';
        puVar7[3] = '\0';
        pMVar8 = MCInst_getOperand(MI,OpNum + iVar9);
        uVar6 = MCOperand_getReg(pMVar8);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) =
             uVar6;
        pcVar3 = MI->flat_insn->detail;
        pcVar3->groups[(ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x5e] = uVar4;
        puVar7 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar7 = *puVar7 + '\x01';
      }
      iVar9 = iVar9 + 1;
    } while (uVar5 - OpNum != iVar9);
  }
  SStream_concat0(O,"}");
  if (MI->csh->detail != CS_OPT_OFF) {
    MI->ac_idx = MI->ac_idx + '\x01';
  }
  return;
}

Assistant:

static void printRegisterList(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned i, e;
#ifndef CAPSTONE_DIET
	uint8_t access = 0;
#endif

	SStream_concat0(O, "{");

#ifndef CAPSTONE_DIET
	if (MI->csh->detail) {
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
	}
#endif

	for (i = OpNum, e = MCInst_getNumOperands(MI); i != e; ++i) {
		if (i != OpNum) SStream_concat0(O, ", ");
		printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, i)));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, i));
#ifndef CAPSTONE_DIET
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
			MI->flat_insn->detail->arm.op_count++;
		}
	}
	SStream_concat0(O, "}");

#ifndef CAPSTONE_DIET
	if (MI->csh->detail) {
		MI->ac_idx++;
	}
#endif
}